

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# completion.c
# Opt level: O2

void complete_cmd(char *buf,char *hint,linenoiseCompletions *lc)

{
  uint uVar1;
  linenoiseCompletions *lc_00;
  char cVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  char *__s;
  DIR *__dirp;
  dirent *pdVar6;
  size_t sVar7;
  COMMAND *pCVar8;
  ulong uVar9;
  long lVar10;
  char *ptr;
  char *pcVar11;
  char opt [3];
  uint local_10ec;
  char **matches;
  linenoiseCompletions *local_10e0;
  char *local_10d8;
  char *local_10d0;
  stat local_10c8;
  char match [4098];
  
  opt[2] = '\0';
  opt[0] = '\0';
  opt[1] = ':';
  matches = (char **)0x0;
  local_10ec = 0;
  local_10e0 = lc;
  local_10d8 = hint;
  if (buf == hint) {
    matches = (char **)0x0;
    for (pCVar8 = commands; pcVar11 = pCVar8->name, pcVar11 != (char *)0x0; pCVar8 = pCVar8 + 1) {
      sVar4 = strlen(hint);
      iVar3 = strncmp(hint,pcVar11,sVar4);
      if (iVar3 == 0) {
        cmd_completion_add_match(pcVar11,&matches,&local_10ec);
      }
    }
LAB_001097f6:
    lc_00 = local_10e0;
    for (uVar9 = 0; uVar9 < local_10ec; uVar9 = uVar9 + 1) {
      linenoiseAddCompletion(lc_00,matches[uVar9]);
      free(matches[uVar9]);
    }
    free(matches);
    return;
  }
  local_10d0 = hint + -1;
  lVar10 = 0;
LAB_00109542:
  if (lVar10 != 0x14) {
    uVar1 = (&DAT_0011ca40)[lVar10 * 6];
    pcVar11 = commands[uVar1].name;
    sVar4 = strlen(pcVar11);
    iVar3 = strncmp(buf,pcVar11,sVar4);
    if ((iVar3 == 0) && (pcVar11 = local_10d0, buf[sVar4] == ' ')) {
      do {
        if (*pcVar11 != ' ') goto LAB_001095b6;
        pcVar11 = pcVar11 + -1;
        pcVar5 = buf;
      } while (pcVar11 != buf);
      goto LAB_001095c8;
    }
    goto LAB_00109636;
  }
  goto LAB_001097f6;
  while (pcVar11 = pcVar11 + -1, pcVar5 = buf, pcVar11 != buf) {
LAB_001095b6:
    pcVar5 = pcVar11;
    if (pcVar11[-1] == ' ') break;
  }
LAB_001095c8:
  if (*pcVar5 == '-') {
    cVar2 = pcVar5[1];
  }
  else {
    cVar2 = '\0';
  }
  opt[0] = cVar2;
  pcVar11 = (char *)(&DAT_0011ca48)[lVar10 * 3];
  if ((cVar2 == '\0') || (pcVar11 != (char *)0x0)) {
    if ((cVar2 != '\0') && (pcVar11 != (char *)0x0)) {
      sVar4 = strlen(pcVar11);
      iVar3 = strncmp(pcVar11,pcVar5,sVar4);
      if (iVar3 == 0) goto LAB_00109692;
      goto LAB_00109636;
    }
    if (cVar2 != '\0') goto LAB_00109692;
  }
  else {
    pcVar11 = strstr(commands[uVar1].optstring,opt);
  }
  if (pcVar11 == (char *)0x0) {
LAB_00109692:
    pcVar11 = local_10d8;
    if ((code *)(&DAT_0011ca50)[lVar10 * 3] == (code *)0x0) {
      local_10e0->path = 1;
      pcVar5 = strrchr(local_10d8,0x2f);
      if (pcVar5 == (char *)0x0) {
        __s = (char *)malloc(0x1003);
        __s[0] = '.';
        __s[1] = '/';
        __s[2] = '\0';
      }
      else {
        __s = (char *)malloc((long)(((int)pcVar5 - (int)pcVar11) + 0x1001));
        sprintf(__s,"%.*s",(ulong)(uint)((int)(pcVar5 + 1) - (int)pcVar11),pcVar11);
        pcVar11 = pcVar5 + 1;
      }
      sVar4 = strlen(__s);
      __dirp = opendir(__s);
      if (__dirp == (DIR *)0x0) {
        free(__s);
      }
      else {
        while (pdVar6 = readdir(__dirp), pdVar6 != (dirent *)0x0) {
          if (pdVar6->d_name[0] != '.') {
            pcVar5 = pdVar6->d_name;
            sVar7 = strlen(pcVar11);
            iVar3 = strncmp(pcVar11,pcVar5,sVar7);
            if (iVar3 == 0) {
              strcpy(__s + sVar4,pcVar5);
              iVar3 = stat(__s,&local_10c8);
              if (iVar3 == 0) {
                strcpy(match,pcVar5);
                if ((local_10c8.st_mode & 0xf000) == 0x4000) {
                  sVar7 = strlen(match);
                  (match + sVar7)[0] = '/';
                  (match + sVar7)[1] = '\0';
                }
                linenoiseAddCompletion(local_10e0,match);
              }
            }
          }
        }
        free(__s);
        closedir(__dirp);
      }
    }
    else {
      (*(code *)(&DAT_0011ca50)[lVar10 * 3])(local_10d8,&matches,&local_10ec);
    }
    goto LAB_001097f6;
  }
LAB_00109636:
  lVar10 = lVar10 + 1;
  goto LAB_00109542;
}

Assistant:

void
complete_cmd(const char *buf, const char *hint, linenoiseCompletions *lc)
{
    struct autocomplete {
        enum COMMAND_INDEX ci;      /**< command index to global variable 'commands' */
        const char *opt;            /**< optional option */
        void (*yl_cb)(const char *, char ***, unsigned int *);  /**< yanglint callback to call */
    } ac[] = {
        {CMD_ADD,         NULL,    NULL},
        {CMD_PRINT,       "-f",    get_print_format_arg},
        {CMD_PRINT,       "-P",    get_schema_completion},
        {CMD_PRINT,       "-o",    NULL},
        {CMD_PRINT,       NULL,    get_model_completion},
        {CMD_SEARCHPATH,  NULL,    NULL},
        {CMD_EXTDATA,     NULL,    NULL},
        {CMD_CLEAR,       "-Y",    NULL},
        {CMD_DATA,        "-t",    get_data_type_arg},
        {CMD_DATA,        "-O",    NULL},
        {CMD_DATA,        "-R",    NULL},
        {CMD_DATA,        "-f",    get_data_in_format_arg},
        {CMD_DATA,        "-F",    get_data_in_format_arg},
        {CMD_DATA,        "-d",    get_data_default_arg},
        {CMD_DATA,        "-o",    NULL},
        {CMD_DATA,        NULL,    NULL},
        {CMD_LIST,        NULL,    get_list_format_arg},
        {CMD_FEATURE,     NULL,    get_model_completion},
        {CMD_VERB,        NULL,    get_verb_arg},
        {CMD_DEBUG,       NULL,    get_debug_arg},
    };
    size_t name_len;
    const char *last, *name, *getoptstr;
    char opt[3] = {'\0', ':', '\0'};
    char **matches = NULL;
    unsigned int match_count = 0, i;

    if (buf == hint) {
        /* command autocomplete */
        get_cmd_completion(hint, &matches, &match_count);

    } else {
        for (i = 0; i < (sizeof ac / sizeof *ac); ++i) {
            /* Find the right command. */
            name = commands[ac[i].ci].name;
            name_len = strlen(name);
            if (strncmp(buf, name, name_len) || (buf[name_len] != ' ')) {
                /* not this command */
                continue;
            }

            /* Select based on the right option. */
            last = get_last_str(buf, hint);
            opt[0] = (last[0] == '-') && last[1] ? last[1] : '\0';
            getoptstr = commands[ac[i].ci].optstring;
            if (!ac[i].opt && opt[0] && strstr(getoptstr, opt)) {
                /* completion for the argument must be defined */
                continue;
            } else if (ac[i].opt && opt[0] && strncmp(ac[i].opt, last, strlen(ac[i].opt))) {
                /* completion for (another) option */
                continue;
            } else if (ac[i].opt && !opt[0]) {
                /* completion is defined for option */
                continue;
            }

            /* callback */
            if (ac[i].yl_cb) {
                ac[i].yl_cb(hint, &matches, &match_count);
            } else {
                path_completion(hint, lc);
            }
            break;
        }
    }

    /* transform matches into autocompletion, if needed */
    for (i = 0; i < match_count; ++i) {
        linenoiseAddCompletion(lc, matches[i]);
        free(matches[i]);
    }
    free(matches);
}